

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  size_t itime;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar38;
  float fVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  size_t local_1c8;
  size_t local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  anon_class_16_2_07cfa4d6 local_130;
  ulong local_120;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_198._8_4_ = 0x7f800000;
  local_198._0_8_ = 0x7f8000007f800000;
  local_198._12_4_ = 0x7f800000;
  auVar43 = ZEXT1664(local_198);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = local_198;
  local_188._8_4_ = 0xff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_188._12_4_ = 0xff800000;
  auVar44 = ZEXT1664(local_188);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_188;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = local_198;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_188;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar25._8_8_ = 0;
  auVar25._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar25._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar28._8_8_ = 0;
  auVar28._0_4_ = time_range->lower;
  auVar28._4_4_ = time_range->upper;
  uVar16 = vcmpps_avx512vl(auVar25,auVar28,1);
  auVar42 = vinsertps_avx(auVar28,auVar25,0x50);
  auVar25 = vinsertps_avx(auVar25,auVar28,0x50);
  bVar7 = (bool)((byte)uVar16 & 1);
  auVar20._0_4_ = (float)((uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar25._0_4_);
  bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
  auVar20._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar25._4_4_;
  bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
  auVar20._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar25._8_4_;
  bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
  auVar20._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar25._12_4_;
  auVar42 = vmovshdup_avx(auVar20);
  fVar45 = auVar42._0_4_;
  if (auVar20._0_4_ <= fVar45) {
    uVar16 = r->_begin;
    local_1c0 = 0;
    auVar50 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar52 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_1c8 = k;
    while( true ) {
      auVar25 = auVar44._0_16_;
      auVar42 = auVar43._0_16_;
      if (r->_end <= uVar16) break;
      BVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar26._8_8_ = 0;
      auVar26._0_4_ = BVar1.lower;
      auVar26._4_4_ = BVar1.upper;
      auVar28 = vmovshdup_avx(auVar26);
      fVar24 = BVar1.lower;
      fVar38 = auVar28._0_4_ - fVar24;
      uVar2 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar16);
      uVar15 = (ulong)(uVar2 + 1);
      pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar15 < (pBVar3->super_RawBufferView).num) {
        fVar22 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar26 = ZEXT416((uint)(fVar22 * ((fVar45 - fVar24) / fVar38) * 0.99999976));
        auVar26 = vroundss_avx(auVar26,auVar26,10);
        auVar48 = vminss_avx(auVar26,ZEXT416((uint)fVar22));
        auVar26 = ZEXT416((uint)(fVar22 * ((auVar20._0_4_ - fVar24) / fVar38) * 1.0000002));
        auVar26 = vroundss_avx(auVar26,auVar26,9);
        auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,auVar26);
        pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tangents.items;
        lVar18 = (long)(int)auVar26._0_4_ * 0x38 + 0x10;
        uVar17 = (long)(int)auVar26._0_4_ - 1;
LAB_01c2da29:
        uVar17 = uVar17 + 1;
        if ((ulong)(long)(int)auVar48._0_4_ < uVar17) {
          local_130.primID = &local_120;
          fVar21 = auVar28._0_4_ - fVar24;
          fVar40 = (auVar20._0_4_ - fVar24) / fVar21;
          fVar21 = (fVar45 - fVar24) / fVar21;
          fVar38 = fVar22 * fVar40;
          fVar24 = fVar22 * fVar21;
          auVar48 = vroundss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),9);
          auVar49 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
          auVar28 = vmaxss_avx(auVar48,ZEXT816(0));
          auVar26 = vminss_avx(auVar49,ZEXT416((uint)fVar22));
          iVar14 = (int)auVar28._0_4_;
          fVar39 = auVar26._0_4_;
          iVar13 = (int)auVar48._0_4_;
          iVar19 = -1;
          if (-1 < iVar13) {
            iVar19 = iVar13;
          }
          iVar12 = (int)fVar22 + 1;
          if ((int)auVar49._0_4_ < (int)fVar22 + 1) {
            iVar12 = (int)auVar49._0_4_;
          }
          local_130.this = this;
          local_120 = uVar16;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_130,(long)iVar14);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_130,(long)(int)fVar39);
          fVar38 = fVar38 - auVar28._0_4_;
          if (iVar12 - iVar19 == 1) {
            auVar28 = vmaxss_avx(ZEXT416((uint)fVar38),ZEXT816(0) << 0x40);
            fVar22 = auVar28._0_4_;
            fVar38 = 1.0 - fVar22;
            auVar46._0_4_ = fVar22 * bupper1.lower.field_0._0_4_;
            auVar46._4_4_ = fVar22 * bupper1.lower.field_0._4_4_;
            auVar46._8_4_ = fVar22 * bupper1.lower.field_0._8_4_;
            auVar46._12_4_ = fVar22 * bupper1.lower.field_0._12_4_;
            auVar29._4_4_ = fVar38;
            auVar29._0_4_ = fVar38;
            auVar29._8_4_ = fVar38;
            auVar29._12_4_ = fVar38;
            auVar48 = vfmadd231ps_fma(auVar46,auVar29,(undefined1  [16])blower0.lower.field_0);
            auVar53._0_4_ = fVar22 * bupper1.upper.field_0._0_4_;
            auVar53._4_4_ = fVar22 * bupper1.upper.field_0._4_4_;
            auVar53._8_4_ = fVar22 * bupper1.upper.field_0._8_4_;
            auVar53._12_4_ = fVar22 * bupper1.upper.field_0._12_4_;
            auVar49 = vfmadd231ps_fma(auVar53,(undefined1  [16])blower0.upper.field_0,auVar29);
            auVar28 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar24)),ZEXT816(0) << 0x40);
            fVar24 = auVar28._0_4_;
            fVar38 = 1.0 - fVar24;
            auVar55._0_4_ = fVar24 * blower0.lower.field_0._0_4_;
            auVar55._4_4_ = fVar24 * blower0.lower.field_0._4_4_;
            auVar55._8_4_ = fVar24 * blower0.lower.field_0._8_4_;
            auVar55._12_4_ = fVar24 * blower0.lower.field_0._12_4_;
            auVar30._4_4_ = fVar38;
            auVar30._0_4_ = fVar38;
            auVar30._8_4_ = fVar38;
            auVar30._12_4_ = fVar38;
            auVar51 = vfmadd231ps_fma(auVar55,auVar30,(undefined1  [16])bupper1.lower.field_0);
            auVar34._0_4_ = fVar24 * blower0.upper.field_0._0_4_;
            auVar34._4_4_ = fVar24 * blower0.upper.field_0._4_4_;
            auVar34._8_4_ = fVar24 * blower0.upper.field_0._8_4_;
            auVar34._12_4_ = fVar24 * blower0.upper.field_0._12_4_;
            auVar36 = vfmadd231ps_fma(auVar34,auVar30,(undefined1  [16])bupper1.upper.field_0);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_130,(long)(iVar14 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_130,(long)((int)fVar39 + -1));
            auVar28 = vmaxss_avx(ZEXT416((uint)fVar38),ZEXT816(0) << 0x40);
            fVar23 = auVar28._0_4_;
            fVar38 = 1.0 - fVar23;
            auVar47._0_4_ = fVar23 * blower1.lower.field_0.m128[0];
            auVar47._4_4_ = fVar23 * blower1.lower.field_0.m128[1];
            auVar47._8_4_ = fVar23 * blower1.lower.field_0.m128[2];
            auVar47._12_4_ = fVar23 * blower1.lower.field_0.m128[3];
            auVar31._4_4_ = fVar38;
            auVar31._0_4_ = fVar38;
            auVar31._8_4_ = fVar38;
            auVar31._12_4_ = fVar38;
            auVar48 = vfmadd231ps_fma(auVar47,auVar31,(undefined1  [16])blower0.lower.field_0);
            auVar54._0_4_ = fVar23 * blower1.upper.field_0.m128[0];
            auVar54._4_4_ = fVar23 * blower1.upper.field_0.m128[1];
            auVar54._8_4_ = fVar23 * blower1.upper.field_0.m128[2];
            auVar54._12_4_ = fVar23 * blower1.upper.field_0.m128[3];
            auVar49 = vfmadd231ps_fma(auVar54,auVar31,(undefined1  [16])blower0.upper.field_0);
            auVar28 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar24)),ZEXT816(0) << 0x40);
            fVar24 = auVar28._0_4_;
            fVar38 = 1.0 - fVar24;
            auVar56._0_4_ = fVar24 * bupper0.lower.field_0.m128[0];
            auVar56._4_4_ = fVar24 * bupper0.lower.field_0.m128[1];
            auVar56._8_4_ = fVar24 * bupper0.lower.field_0.m128[2];
            auVar56._12_4_ = fVar24 * bupper0.lower.field_0.m128[3];
            auVar32._4_4_ = fVar38;
            auVar32._0_4_ = fVar38;
            auVar32._8_4_ = fVar38;
            auVar32._12_4_ = fVar38;
            auVar51 = vfmadd231ps_fma(auVar56,auVar32,(undefined1  [16])bupper1.lower.field_0);
            auVar35._0_4_ = fVar24 * bupper0.upper.field_0.m128[0];
            auVar35._4_4_ = fVar24 * bupper0.upper.field_0.m128[1];
            auVar35._8_4_ = fVar24 * bupper0.upper.field_0.m128[2];
            auVar35._12_4_ = fVar24 * bupper0.upper.field_0.m128[3];
            auVar36 = vfmadd231ps_fma(auVar35,auVar32,(undefined1  [16])bupper1.upper.field_0);
            if (iVar13 < 0) {
              iVar13 = -1;
            }
            itime = (size_t)iVar13;
            while (itime = itime + 1, (long)itime < (long)iVar12) {
              fVar24 = ((float)(int)itime / fVar22 - fVar40) / (fVar21 - fVar40);
              fVar38 = 1.0 - fVar24;
              auVar41._0_4_ = auVar51._0_4_ * fVar24;
              fVar57 = auVar51._4_4_;
              auVar41._4_4_ = fVar57 * fVar24;
              fVar58 = auVar51._8_4_;
              auVar41._8_4_ = fVar58 * fVar24;
              fVar59 = auVar51._12_4_;
              auVar41._12_4_ = fVar59 * fVar24;
              auVar33._4_4_ = fVar38;
              auVar33._0_4_ = fVar38;
              auVar33._8_4_ = fVar38;
              auVar33._12_4_ = fVar38;
              auVar28 = vfmadd231ps_fma(auVar41,auVar33,auVar48);
              auVar27._0_4_ = auVar36._0_4_ * fVar24;
              fVar38 = auVar36._4_4_;
              auVar27._4_4_ = fVar38 * fVar24;
              fVar39 = auVar36._8_4_;
              auVar27._8_4_ = fVar39 * fVar24;
              fVar23 = auVar36._12_4_;
              auVar27._12_4_ = fVar23 * fVar24;
              auVar26 = vfmadd231ps_fma(auVar27,auVar49,auVar33);
              linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_130,itime);
              local_1b8 = auVar49._0_4_;
              fStack_1b4 = auVar49._4_4_;
              fStack_1b0 = auVar49._8_4_;
              fStack_1ac = auVar49._12_4_;
              local_1a8 = auVar48._0_4_;
              fStack_1a4 = auVar48._4_4_;
              fStack_1a0 = auVar48._8_4_;
              fStack_19c = auVar48._12_4_;
              auVar28 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar28);
              auVar48 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar26);
              auVar26 = vminps_avx(auVar28,ZEXT816(0) << 0x40);
              auVar28 = vmaxps_avx(auVar48,ZEXT816(0) << 0x40);
              auVar48._0_4_ = local_1a8 + auVar26._0_4_;
              auVar48._4_4_ = fStack_1a4 + auVar26._4_4_;
              auVar48._8_4_ = fStack_1a0 + auVar26._8_4_;
              auVar48._12_4_ = fStack_19c + auVar26._12_4_;
              auVar51._0_4_ = auVar51._0_4_ + auVar26._0_4_;
              auVar51._4_4_ = fVar57 + auVar26._4_4_;
              auVar51._8_4_ = fVar58 + auVar26._8_4_;
              auVar51._12_4_ = fVar59 + auVar26._12_4_;
              auVar49._0_4_ = local_1b8 + auVar28._0_4_;
              auVar49._4_4_ = fStack_1b4 + auVar28._4_4_;
              auVar49._8_4_ = fStack_1b0 + auVar28._8_4_;
              auVar49._12_4_ = fStack_1ac + auVar28._12_4_;
              auVar36._0_4_ = auVar36._0_4_ + auVar28._0_4_;
              auVar36._4_4_ = fVar38 + auVar28._4_4_;
              auVar36._8_4_ = fVar39 + auVar28._8_4_;
              auVar36._12_4_ = fVar23 + auVar28._12_4_;
            }
          }
          uVar10 = vcmpps_avx512vl(auVar48,auVar49,2);
          auVar43 = ZEXT1664(auVar42);
          auVar44 = ZEXT1664(auVar25);
          auVar50 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar52 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if (((~(ushort)uVar10 & 7) == 0) &&
             (uVar10 = vcmpps_avx512vl(auVar51,auVar36,2), (~(ushort)uVar10 & 7) == 0)) {
            auVar28 = vminps_avx(auVar48,auVar51);
            aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar28,ZEXT416(geomID),0x30);
            auVar28 = vmaxps_avx(auVar49,auVar36);
            aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar28,ZEXT416((uint)uVar16),0x30);
            auVar37._0_4_ = aVar8.x + aVar9.x;
            auVar37._4_4_ = aVar8.y + aVar9.y;
            auVar37._8_4_ = aVar8.z + aVar9.z;
            auVar37._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
            local_198 = vminps_avx(local_198,(undefined1  [16])aVar8);
            local_188 = vmaxps_avx(local_188,(undefined1  [16])aVar9);
            auVar42 = vminps_avx(auVar42,auVar37);
            auVar43 = ZEXT1664(auVar42);
            auVar42 = vmaxps_avx(auVar25,auVar37);
            auVar44 = ZEXT1664(auVar42);
            local_1c0 = local_1c0 + 1;
            prims[local_1c8].lower.field_0.field_1 = aVar8;
            prims[local_1c8].upper.field_0.field_1 = aVar9;
            local_1c8 = local_1c8 + 1;
          }
        }
        else {
          lVar5 = *(long *)((long)pBVar3 + lVar18 + -0x10);
          lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar18);
          auVar26 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar2);
          auVar49 = auVar50._0_16_;
          uVar10 = vcmpps_avx512vl(auVar26,auVar49,6);
          auVar51 = auVar52._0_16_;
          uVar11 = vcmpps_avx512vl(auVar26,auVar51,1);
          if ((byte)((byte)uVar10 & (byte)uVar11) == 0xf) {
            auVar26 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar15);
            uVar10 = vcmpps_avx512vl(auVar26,auVar49,6);
            uVar11 = vcmpps_avx512vl(auVar26,auVar51,1);
            if ((byte)((byte)uVar10 & (byte)uVar11) == 0xf) {
              lVar5 = *(long *)((long)pBVar4 + lVar18 + -0x10);
              lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar18);
              auVar26 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar2);
              uVar10 = vcmpps_avx512vl(auVar26,auVar49,6);
              uVar11 = vcmpps_avx512vl(auVar26,auVar51,1);
              if ((byte)((byte)uVar10 & (byte)uVar11) == 0xf) goto code_r0x01c2dabf;
            }
          }
        }
      }
LAB_01c2df52:
      uVar16 = uVar16 + 1;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_198._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_188._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = auVar42;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
     field_0.m128 = auVar25;
    __return_storage_ptr__->end = local_1c0;
  }
  return __return_storage_ptr__;
code_r0x01c2dabf:
  lVar18 = lVar18 + 0x38;
  auVar26 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar15);
  uVar10 = vcmpps_avx512vl(auVar26,auVar49,6);
  uVar11 = vcmpps_avx512vl(auVar26,auVar51,1);
  if ((byte)((byte)uVar10 & (byte)uVar11) != 0xf) goto LAB_01c2df52;
  goto LAB_01c2da29;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }